

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O3

bool __thiscall reflection::EnumVal::Verify(EnumVal *this,Verifier *verifier)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  String *str;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec_00;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if ((*(ushort *)(this + -(long)*(int *)this) < 5) ||
       (uVar2 = (ulong)*(ushort *)(this + (4 - (long)*(int *)this)), uVar2 == 0)) {
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + *(uint *)(this + uVar2) + uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if (((((bVar1) &&
          (bVar1 = flatbuffers::Table::VerifyField<long>(&this->super_Table,verifier,6,8), bVar1))
         && (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10),
            bVar1)) &&
        (((*(ushort *)(this + -(long)*(int *)this) < 0xb ||
          (uVar2 = (ulong)*(ushort *)(this + (10 - (long)*(int *)this)), uVar2 == 0)) ||
         (bVar1 = Type::Verify((Type *)(this + *(uint *)(this + uVar2) + uVar2),verifier), bVar1))))
       && (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0xc),
          bVar1)) {
      lVar3 = -(long)*(int *)this;
      if ((0xc < *(ushort *)(this + -(long)*(int *)this)) &&
         (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xc), uVar2 != 0)) {
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                          (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                           (size_t *)0x0);
        if (!bVar1) {
          return false;
        }
        lVar3 = -(long)*(int *)this;
      }
      if ((*(ushort *)(this + lVar3) < 0xd) ||
         (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xc), uVar2 == 0)) {
        vec = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
      }
      else {
        vec = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
              (this + *(uint *)(this + uVar2) + uVar2);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec);
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0xe),
         bVar1)) {
        lVar3 = -(long)*(int *)this;
        if ((0xe < *(ushort *)(this + -(long)*(int *)this)) &&
           (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xe), uVar2 != 0)) {
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                             (size_t *)0x0);
          if (!bVar1) {
            return false;
          }
          lVar3 = -(long)*(int *)this;
        }
        if ((*(ushort *)(this + lVar3) < 0xf) ||
           (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xe), uVar2 == 0)) {
          vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
        }
        else {
          vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                   (this + *(uint *)(this + uVar2) + uVar2);
        }
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                          (verifier,vec_00);
        if (bVar1) {
          verifier->depth_ = verifier->depth_ - 1;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyField<int64_t>(verifier, VT_VALUE, 8) &&
           VerifyOffset(verifier, VT_UNION_TYPE) &&
           verifier.VerifyTable(union_type()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           verifier.EndTable();
  }